

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psobjs.c
# Opt level: O0

void t1_make_subfont(FT_Face face,PS_Private priv,CFF_SubFont subfont)

{
  byte bVar1;
  FT_UInt32 FVar2;
  uint uVar3;
  uint local_34;
  uint local_30;
  FT_UInt32 seed;
  FT_UInt count;
  FT_UInt n;
  CFF_Private cpriv;
  CFF_SubFont subfont_local;
  PS_Private priv_local;
  FT_Face face_local;
  
  _count = &subfont->private_dict;
  cpriv = (CFF_Private)subfont;
  subfont_local = (CFF_SubFont)priv;
  priv_local = (PS_Private)face;
  memset(subfont,0,0x4c8);
  memset(_count,0,0x2d8);
  bVar1 = (byte)(subfont_local->font_dict).copyright;
  _count->num_blue_values = bVar1;
  for (seed = 0; seed < bVar1; seed = seed + 1) {
    _count->blue_values[seed] =
         (long)*(short *)((long)&(subfont_local->font_dict).full_name + (ulong)seed * 2);
  }
  bVar1 = *(byte *)((long)&(subfont_local->font_dict).copyright + 1);
  _count->num_other_blues = bVar1;
  for (seed = 0; seed < bVar1; seed = seed + 1) {
    _count->other_blues[seed] =
         (long)*(short *)((long)&(subfont_local->font_dict).underline_position + (ulong)seed * 2);
  }
  bVar1 = *(byte *)((long)&(subfont_local->font_dict).copyright + 2);
  _count->num_family_blues = bVar1;
  for (seed = 0; seed < bVar1; seed = seed + 1) {
    _count->family_blues[seed] =
         (long)*(short *)((long)&(subfont_local->font_dict).charstring_type + (ulong)seed * 2);
  }
  bVar1 = *(byte *)((long)&(subfont_local->font_dict).copyright + 3);
  _count->num_family_other_blues = bVar1;
  for (seed = 0; seed < bVar1; seed = seed + 1) {
    _count->family_other_blues[seed] =
         (long)*(short *)((long)&(subfont_local->font_dict).font_matrix.yy + (ulong)seed * 2);
  }
  _count->blue_scale = (subfont_local->font_dict).font_offset.x;
  _count->blue_shift = (long)(int)(subfont_local->font_dict).font_offset.y;
  _count->blue_fuzz = (long)*(int *)((long)&(subfont_local->font_dict).font_offset.y + 4);
  _count->standard_width = (ulong)(ushort)(subfont_local->font_dict).unique_id;
  _count->standard_height = (ulong)*(ushort *)((long)&(subfont_local->font_dict).unique_id + 2);
  bVar1 = *(byte *)((long)&(subfont_local->font_dict).unique_id + 4);
  _count->num_snap_widths = bVar1;
  for (seed = 0; seed < bVar1; seed = seed + 1) {
    _count->snap_widths[seed] =
         (long)*(short *)((long)&(subfont_local->font_dict).font_bbox.xMin + (ulong)seed * 2);
  }
  bVar1 = *(byte *)((long)&(subfont_local->font_dict).unique_id + 5);
  _count->num_snap_heights = bVar1;
  local_30 = (uint)bVar1;
  for (seed = 0; seed < local_30; seed = seed + 1) {
    _count->snap_heights[seed] =
         (long)*(short *)((long)&(subfont_local->font_dict).font_bbox.yMax + (ulong)seed * 2 + 2);
  }
  _count->force_bold = *(FT_Bool *)((long)&(subfont_local->font_dict).unique_id + 6);
  _count->lenIV = (subfont_local->font_dict).notice;
  _count->language_group = (FT_Int)(subfont_local->font_dict).private_offset;
  _count->expansion_factor = (subfont_local->font_dict).charstrings_offset;
  _count->subfont = (CFF_SubFont)cpriv;
  if ((*(int *)(*(long *)(priv_local[1].blue_values + 2) + 0x74) != -1) &&
     (*(undefined4 *)(cpriv[1].snap_widths + 6) =
           *(undefined4 *)(*(long *)(priv_local[1].blue_values + 2) + 0x74),
     *(int *)(*(long *)(priv_local[1].blue_values + 2) + 0x74) != 0)) {
    do {
      FVar2 = cff_random(*(FT_UInt32 *)(*(long *)(priv_local[1].blue_values + 2) + 0x74));
      *(FT_UInt32 *)(*(long *)(priv_local[1].blue_values + 2) + 0x74) = FVar2;
    } while (*(int *)(*(long *)(priv_local[1].blue_values + 2) + 0x74) < 0);
  }
  if ((int)cpriv[1].snap_widths[6] == 0) {
    uVar3 = (uint)&local_34 ^ (uint)&priv_local ^ (uint)&cpriv;
    local_34 = uVar3 ^ uVar3 >> 10 ^ uVar3 >> 0x14;
    if (local_34 == 0) {
      local_34 = 0x7384;
    }
    *(uint *)(cpriv[1].snap_widths + 6) = local_34;
  }
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  t1_make_subfont( FT_Face      face,
                   PS_Private   priv,
                   CFF_SubFont  subfont )
  {
    CFF_Private  cpriv = &subfont->private_dict;
    FT_UInt      n, count;


    FT_ZERO( subfont );
    FT_ZERO( cpriv );

    count = cpriv->num_blue_values = priv->num_blue_values;
    for ( n = 0; n < count; n++ )
      cpriv->blue_values[n] = (FT_Pos)priv->blue_values[n];

    count = cpriv->num_other_blues = priv->num_other_blues;
    for ( n = 0; n < count; n++ )
      cpriv->other_blues[n] = (FT_Pos)priv->other_blues[n];

    count = cpriv->num_family_blues = priv->num_family_blues;
    for ( n = 0; n < count; n++ )
      cpriv->family_blues[n] = (FT_Pos)priv->family_blues[n];

    count = cpriv->num_family_other_blues = priv->num_family_other_blues;
    for ( n = 0; n < count; n++ )
      cpriv->family_other_blues[n] = (FT_Pos)priv->family_other_blues[n];

    cpriv->blue_scale = priv->blue_scale;
    cpriv->blue_shift = (FT_Pos)priv->blue_shift;
    cpriv->blue_fuzz  = (FT_Pos)priv->blue_fuzz;

    cpriv->standard_width  = (FT_Pos)priv->standard_width[0];
    cpriv->standard_height = (FT_Pos)priv->standard_height[0];

    count = cpriv->num_snap_widths = priv->num_snap_widths;
    for ( n = 0; n < count; n++ )
      cpriv->snap_widths[n] = (FT_Pos)priv->snap_widths[n];

    count = cpriv->num_snap_heights = priv->num_snap_heights;
    for ( n = 0; n < count; n++ )
      cpriv->snap_heights[n] = (FT_Pos)priv->snap_heights[n];

    cpriv->force_bold       = priv->force_bold;
    cpriv->lenIV            = priv->lenIV;
    cpriv->language_group   = priv->language_group;
    cpriv->expansion_factor = priv->expansion_factor;

    cpriv->subfont = subfont;


    /* Initialize the random number generator. */
    if ( face->internal->random_seed != -1 )
    {
      /* If we have a face-specific seed, use it.    */
      /* If non-zero, update it to a positive value. */
      subfont->random = (FT_UInt32)face->internal->random_seed;
      if ( face->internal->random_seed )
      {
        do
        {
          face->internal->random_seed = (FT_Int32)cff_random(
            (FT_UInt32)face->internal->random_seed );

        } while ( face->internal->random_seed < 0 );
      }
    }
    if ( !subfont->random )
    {
      FT_UInt32  seed;


      /* compute random seed from some memory addresses */
      seed = (FT_UInt32)( (FT_Offset)(char*)&seed    ^
                          (FT_Offset)(char*)&face    ^
                          (FT_Offset)(char*)&subfont );
      seed = seed ^ ( seed >> 10 ) ^ ( seed >> 20 );
      if ( seed == 0 )
        seed = 0x7384;

      subfont->random = seed;
    }
  }